

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O0

void __thiscall DiskGen::Write(DiskGen *this,uchar byte,bool bSync)

{
  bool bSync_local;
  uchar byte_local;
  DiskGen *this_local;
  
  this->read_ = false;
  if ((bSync) && (byte == 0xa1)) {
    this->sync_write_ = true;
    this->byte_to_write_ = sync_seq_short1;
  }
  else if ((bSync) && (byte == 0xc2)) {
    this->sync_write_ = true;
    this->byte_to_write_ = sync_seq_short2;
  }
  else {
    this->sync_write_ = false;
    this->byte_to_write_ = (ushort)byte;
  }
  this->write_bit_ = 0;
  return;
}

Assistant:

void DiskGen::Write(unsigned char byte, bool bSync)
{
   read_ = false;

   // Convert to MFM Sync bytes
   if (bSync && byte == 0xA1)
   {
      sync_write_ = true;
      byte_to_write_ = sync_seq_short1;
   }
   else if (bSync && byte == 0xC2)
   {
      sync_write_ = true;
      byte_to_write_ = sync_seq_short2;
   }
   else
   {
      sync_write_ = false;
      byte_to_write_ = byte;
   }

   //LOGB(byte);

   write_bit_ = 0;
}